

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O2

Stream * nv::operator<<(Stream *s,DDSHeader *header)

{
  operator<<(s,&header->fourcc);
  operator<<(s,&header->size);
  operator<<(s,&header->flags);
  operator<<(s,&header->height);
  operator<<(s,&header->width);
  operator<<(s,&header->pitch);
  operator<<(s,&header->depth);
  operator<<(s,&header->mipmapcount);
  (*s->_vptr_Stream[2])(s,header->reserved,0x2c);
  operator<<(s,&(header->pf).size);
  operator<<(s,&(header->pf).flags);
  operator<<(s,&(header->pf).fourcc);
  operator<<(s,&(header->pf).bitcount);
  operator<<(s,&(header->pf).rmask);
  operator<<(s,&(header->pf).gmask);
  operator<<(s,&(header->pf).bmask);
  operator<<(s,&(header->pf).amask);
  operator<<(s,&(header->caps).caps1);
  operator<<(s,&(header->caps).caps2);
  operator<<(s,&(header->caps).caps3);
  operator<<(s,&(header->caps).caps4);
  operator<<(s,&header->notused);
  if ((header->pf).fourcc == 0x30315844) {
    operator<<(s,&(header->header10).dxgiFormat);
    operator<<(s,&(header->header10).resourceDimension);
    operator<<(s,&(header->header10).miscFlag);
    operator<<(s,&(header->header10).arraySize);
    operator<<(s,&(header->header10).reserved);
  }
  return s;
}

Assistant:

Stream & operator<< (Stream & s, DDSHeader & header)
	{
		nvStaticCheck(sizeof(DDSHeader) == 148);
		s << header.fourcc;
		s << header.size;
		s << header.flags;
		s << header.height;
		s << header.width;
		s << header.pitch;
		s << header.depth;
		s << header.mipmapcount;
		s.serialize(header.reserved, 11 * sizeof(uint));
		s << header.pf;
		s << header.caps;
		s << header.notused;
		
		if (header.hasDX10Header())
		{
			s << header.header10;
		}
		
		return s;
	}